

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizard::removePage(QWizard *this,int id)

{
  PageMap *this_00;
  QWizardPrivate *this_01;
  QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
  *pQVar1;
  size_t sVar2;
  _Rb_tree_node_base *p_Var3;
  QWizardField *pQVar4;
  bool bVar5;
  long lVar6;
  QWidget *widget;
  _Rb_tree_color _Var7;
  uint index;
  long in_FS_OFFSET;
  int id_local;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QWizardPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  this_00 = &this_01->pageMap;
  pQVar1 = (this_01->pageMap).d.d.ptr;
  id_local = id;
  if (((pQVar1 != (QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
                   *)0x0) &&
      (sVar2 = (pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count, 0 < (long)sVar2)) &&
     (this_01->start == id)) {
    p_Var3 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
    _Var7 = p_Var3[1]._M_color;
    if (_Var7 == id) {
      if (sVar2 == 1) {
        _Var7 = ~_S_red;
      }
      else {
        lVar6 = std::_Rb_tree_increment(p_Var3);
        _Var7 = *(_Rb_tree_color *)(lVar6 + 0x20);
      }
    }
    this_01->start = _Var7;
    this_01->startSetByUser = false;
  }
  bVar5 = QMap<int,_QWizardPage_*>::contains(this_00,&id_local);
  if (bVar5) {
    pageRemoved(this,id_local);
  }
  bVar5 = QListSpecialMethodsBase<int>::contains<int>
                    ((QListSpecialMethodsBase<int> *)&this_01->history,&id_local);
  if (bVar5) {
    if (id_local != this_01->current) {
      widget = &QMap<int,_QWizardPage_*>::take(this_00,&id_local)->super_QWidget;
      QtPrivate::sequential_erase_one<QList<int>,int>(&this_01->history,&id_local);
      QWizardPrivate::_q_updateButtonStates(this_01);
      goto LAB_004c3f27;
    }
    if ((this_01->history).d.size != 1) {
      back(this);
      goto LAB_004c3f0f;
    }
    QWizardPrivate::reset(this_01);
    widget = &QMap<int,_QWizardPage_*>::take(this_00,&id_local)->super_QWidget;
    pQVar1 = (this_01->pageMap).d.d.ptr;
    if ((pQVar1 != (QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
                    *)0x0) && ((pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
      restart(this);
      goto LAB_004c3f27;
    }
  }
  else {
LAB_004c3f0f:
    widget = &QMap<int,_QWizardPage_*>::take(this_00,&id_local)->super_QWidget;
  }
  QWizardPrivate::updateCurrentPage(this_01);
LAB_004c3f27:
  if (widget != (QWidget *)0x0) {
    if (*(char *)(*(long *)&widget->field_0x8 + 0x30e) == '\x01') {
      (**(code **)(*(long *)&(this->super_QDialog).super_QWidget + 0x1e0))(this,id_local);
      *(undefined1 *)(*(long *)&widget->field_0x8 + 0x30e) = 0;
    }
    QLayout::removeWidget((QLayout *)this_01->pageVBoxLayout,widget);
    index = (uint)(this_01->fields).d.size;
    while( true ) {
      index = index - 1;
      if ((int)index < 0) break;
      pQVar4 = (this_01->fields).d.ptr;
      if (&(pQVar4[index & 0x7fffffff].page)->super_QWidget == widget) {
        QList<QWizardField>::emplaceBack<QWizardField_const&>
                  ((QList<QWizardField> *)(*(long *)&widget->field_0x8 + 0x2f0),
                   pQVar4 + (index & 0x7fffffff));
        QWizardPrivate::removeFieldAt(this_01,index);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizard::removePage(int id)
{
    Q_D(QWizard);

    QWizardPage *removedPage = nullptr;

    // update startItem accordingly
    if (d->pageMap.size() > 0) { // only if we have any pages
        if (d->start == id) {
            const int firstId = d->pageMap.constBegin().key();
            if (firstId == id) {
                if (d->pageMap.size() > 1)
                    d->start = (++d->pageMap.constBegin()).key(); // secondId
                else
                    d->start = -1; // removing the last page
            } else { // startSetByUser has to be "true" here
                d->start = firstId;
            }
            d->startSetByUser = false;
        }
    }

    if (d->pageMap.contains(id))
        emit pageRemoved(id);

    if (!d->history.contains(id)) {
        // Case 1: removing a page not in the history
        removedPage = d->pageMap.take(id);
        d->updateCurrentPage();
    } else if (id != d->current) {
        // Case 2: removing a page in the history before the current page
        removedPage = d->pageMap.take(id);
        d->history.removeOne(id);
        d->_q_updateButtonStates();
    } else if (d->history.size() == 1) {
        // Case 3: removing the current page which is the first (and only) one in the history
        d->reset();
        removedPage = d->pageMap.take(id);
        if (d->pageMap.isEmpty())
            d->updateCurrentPage();
        else
            restart();
    } else {
        // Case 4: removing the current page which is not the first one in the history
        back();
        removedPage = d->pageMap.take(id);
        d->updateCurrentPage();
    }

    if (removedPage) {
        if (removedPage->d_func()->initialized) {
            cleanupPage(id);
            removedPage->d_func()->initialized = false;
        }

        d->pageVBoxLayout->removeWidget(removedPage);

        for (int i = d->fields.size() - 1; i >= 0; --i) {
            if (d->fields.at(i).page == removedPage) {
                removedPage->d_func()->pendingFields += d->fields.at(i);
                d->removeFieldAt(i);
            }
        }
    }
}